

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

Curve * __thiscall ON_ShutLining::Curve::operator=(Curve *this,Curve *c)

{
  bool bVar1;
  int p;
  double d;
  ON_UUID local_28;
  Curve *local_18;
  Curve *c_local;
  Curve *this_local;
  
  if (this != c) {
    local_18 = c;
    c_local = this;
    local_28 = Id(c);
    SetId(this,&local_28);
    bVar1 = Enabled(local_18);
    SetEnabled(this,bVar1);
    d = Radius(local_18);
    SetRadius(this,d);
    p = Profile(local_18);
    SetProfile(this,p);
    bVar1 = Pull(local_18);
    SetPull(this,bVar1);
    bVar1 = IsBump(local_18);
    SetIsBump(this,bVar1);
  }
  return this;
}

Assistant:

const ON_ShutLining::Curve& ON_ShutLining::Curve::operator = (const ON_ShutLining::Curve& c)
{
  if (this != &c)
  {
    SetId     (c.Id());
    SetEnabled(c.Enabled());
    SetRadius (c.Radius());
    SetProfile(c.Profile());
    SetPull   (c.Pull());
    SetIsBump (c.IsBump());
  }

  return *this;
}